

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O3

REF_STATUS ref_fixture_twod_square_circle(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  REF_INT RVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  int iVar15;
  int iVar16;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c [27];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    pcVar14 = "create";
    uVar9 = 0x810;
    goto LAB_0012414e;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar1->twod = 1;
  local_8c[1] = 1;
  iVar8 = ref_mpi->n;
  iVar6 = ref_mpi->id;
  iVar7 = 0;
  iVar5 = (int)(0x17 / (long)iVar8);
  iVar16 = iVar5 * iVar8;
  if (0x17 < iVar16) {
    iVar7 = ((((iVar8 + 0x17) / iVar8) * (iVar16 + -0x18)) / iVar5 - iVar16) + 0x18;
  }
  if (iVar6 == iVar7) {
LAB_001213b9:
    uVar4 = ref_node_add(ref_node,0,&local_98);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x823;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_98;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,1,&local_94);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x824;
      goto LAB_0012414e;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_94;
    pRVar3[lVar13 * 0xf] = 0.3333333333333333;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,2,&local_90);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x825;
      goto LAB_0012414e;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_90;
    pRVar3[lVar13 * 0xf] = 0.6666666666666666;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_90 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,3,local_8c);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x826;
      goto LAB_0012414e;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_8c[0];
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_8c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_98,&local_9c);
    if (uVar4 != 0) {
      pcVar14 = "add tri";
      uVar9 = 0x828;
      goto LAB_0012414e;
    }
    iVar16 = ref_mpi->n;
    iVar6 = ref_mpi->id;
    iVar8 = (iVar16 + 0x17) / iVar16;
    iVar5 = (int)(0x17 / (long)iVar16);
    iVar16 = iVar5 * iVar16;
    iVar15 = 0x18 - iVar16;
  }
  else {
    iVar8 = (iVar8 + 0x17) / iVar8;
    iVar7 = 0;
    if (iVar8 + 1U < 3) {
      iVar7 = iVar8;
    }
    iVar15 = 0x18 - iVar16;
    if (iVar15 <= iVar7) {
      iVar7 = (1 - iVar8 * iVar15) / iVar5 + iVar15;
    }
    if (iVar6 == iVar7) goto LAB_001213b9;
    iVar7 = (int)(2 / (long)iVar8);
    if (iVar15 <= iVar7) {
      iVar7 = (2 - iVar8 * iVar15) / iVar5 + iVar15;
    }
    if (iVar6 == iVar7) goto LAB_001213b9;
    iVar7 = (int)(3 / (long)iVar8);
    if (iVar15 <= iVar7) {
      iVar7 = (3 - iVar8 * iVar15) / iVar5 + iVar15;
    }
    if (iVar6 == iVar7) goto LAB_001213b9;
  }
  local_8c[1] = 2;
  iVar7 = (int)(3 / (long)iVar8);
  if (iVar15 <= iVar7) {
    iVar7 = (3 - iVar15 * iVar8) / iVar5 + iVar15;
  }
  if (iVar6 == iVar7) {
LAB_00121982:
    uVar4 = ref_node_add(ref_node,3,&local_98);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x838;
      goto LAB_0012414e;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_98;
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,4,&local_94);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x839;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_94;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 1.0;
    pRVar3[1] = 0.3333333333333333;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,5,&local_90);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x83a;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_90;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 1.0;
    pRVar3[1] = 0.6666666666666666;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_90 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,6,local_8c);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x83b;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_8c[0];
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 1.0;
    pRVar3[1] = 1.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_8c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_98,&local_9c);
    if (uVar4 != 0) {
      pcVar14 = "add tri";
      uVar9 = 0x83d;
      goto LAB_0012414e;
    }
    iVar16 = ref_mpi->n;
    iVar6 = ref_mpi->id;
    iVar8 = (iVar16 + 0x17) / iVar16;
    iVar12 = (int)(6 / (long)iVar8);
    iVar5 = (int)(0x17 / (long)iVar16);
    iVar16 = iVar5 * iVar16;
    iVar15 = 0x18 - iVar16;
  }
  else {
    iVar7 = (int)(4 / (long)iVar8);
    if (iVar15 <= iVar7) {
      iVar7 = (4 - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar7) goto LAB_00121982;
    iVar7 = (int)(5 / (long)iVar8);
    if (iVar15 <= iVar7) {
      iVar7 = (5 - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar7) goto LAB_00121982;
    iVar12 = (int)(6 / (long)iVar8);
    iVar7 = iVar12;
    if (iVar15 <= iVar12) {
      iVar7 = (6 - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar7) goto LAB_00121982;
  }
  local_8c[1] = 3;
  if (iVar15 <= iVar12) {
    iVar12 = (6 - iVar15 * iVar8) / iVar5 + iVar15;
  }
  if (iVar6 == iVar12) {
LAB_00121f53:
    uVar4 = ref_node_add(ref_node,6,&local_98);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x84d;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_98;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 1.0;
    pRVar3[1] = 1.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,7,&local_94);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x84e;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_94;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.6666666666666666;
    pRVar3[1] = 1.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,8,&local_90);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x84f;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_90;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.3333333333333333;
    pRVar3[1] = 1.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_90 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,9,local_8c);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x850;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_8c[0];
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *(undefined4 *)pRVar3 = 0;
    *(undefined4 *)((long)pRVar3 + 4) = 0;
    *(undefined4 *)(pRVar3 + 1) = 0;
    *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_8c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_98,&local_9c);
    if (uVar4 != 0) {
      pcVar14 = "add tri";
      uVar9 = 0x852;
      goto LAB_0012414e;
    }
    iVar16 = ref_mpi->n;
    iVar6 = ref_mpi->id;
    iVar8 = (iVar16 + 0x17) / iVar16;
    iVar12 = (int)(9 / (long)iVar8);
    iVar5 = (int)(0x17 / (long)iVar16);
    iVar16 = iVar5 * iVar16;
    iVar15 = 0x18 - iVar16;
  }
  else {
    iVar7 = (int)(7 / (long)iVar8);
    if (iVar15 <= iVar7) {
      iVar7 = (7 - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar7) goto LAB_00121f53;
    iVar7 = (int)(8 / (long)iVar8);
    if (iVar15 <= iVar7) {
      iVar7 = (8 - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar7) goto LAB_00121f53;
    iVar12 = (int)(9 / (long)iVar8);
    iVar7 = iVar12;
    if (iVar15 <= iVar12) {
      iVar7 = (9 - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar7) goto LAB_00121f53;
  }
  local_8c[1] = 4;
  if (iVar15 <= iVar12) {
    iVar12 = (9 - iVar15 * iVar8) / iVar5 + iVar15;
  }
  if (iVar6 == iVar12) {
LAB_00122511:
    uVar4 = ref_node_add(ref_node,9,&local_98);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x862;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_98;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *(undefined4 *)pRVar3 = 0;
    *(undefined4 *)((long)pRVar3 + 4) = 0;
    *(undefined4 *)(pRVar3 + 1) = 0;
    *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,10,&local_94);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x863;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_94;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *(undefined4 *)pRVar3 = 0;
    *(undefined4 *)((long)pRVar3 + 4) = 0;
    *(undefined4 *)(pRVar3 + 1) = 0x55555555;
    *(undefined4 *)((long)pRVar3 + 0xc) = 0x3fe55555;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0xb,&local_90);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x864;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_90;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *(undefined4 *)pRVar3 = 0;
    *(undefined4 *)((long)pRVar3 + 4) = 0;
    *(undefined4 *)(pRVar3 + 1) = 0x55555555;
    *(undefined4 *)((long)pRVar3 + 0xc) = 0x3fd55555;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_90 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0,local_8c);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x865;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_8c[0];
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_8c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_98,&local_9c);
    if (uVar4 != 0) {
      pcVar14 = "add tri";
      uVar9 = 0x867;
      goto LAB_0012414e;
    }
    iVar16 = ref_mpi->n;
    iVar6 = ref_mpi->id;
    iVar8 = (iVar16 + 0x17) / iVar16;
    iVar5 = (int)(0x17 / (long)iVar16);
    iVar15 = 0x18 - iVar5 * iVar16;
  }
  else {
    iVar7 = (int)(10 / (long)iVar8);
    if (iVar15 <= iVar7) {
      iVar7 = (10 - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar7) goto LAB_00122511;
    iVar7 = (int)(0xb / (long)iVar8);
    if (iVar15 <= iVar7) {
      iVar7 = (0xb - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar7) goto LAB_00122511;
    iVar7 = 0;
    if (0x17 < iVar16) {
      iVar7 = (((iVar16 + -0x18) * iVar8) / iVar5 - iVar16) + 0x18;
    }
    if (iVar6 == iVar7) goto LAB_00122511;
  }
  local_8c[1] = 5;
  iVar16 = (int)(0xc / (long)iVar8);
  if (iVar15 <= iVar16) {
    iVar16 = (0xc - iVar15 * iVar8) / iVar5 + iVar15;
  }
  if (iVar6 == iVar16) {
LAB_00122ad9:
    uVar4 = ref_node_add(ref_node,0xc,&local_98);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x878;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_98;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.75;
    pRVar3[1] = 0.4999999999999984;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0xd,&local_94);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x87a;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_94;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.7165063509461089;
    pRVar3[1] = 0.3749999999999987;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0xe,&local_90);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x87c;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_90;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.6249999999999989;
    pRVar3[1] = 0.2834936490538897;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_90 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0xf,local_8c);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x87e;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_8c[0];
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.49999999999999883;
    pRVar3[1] = 0.25;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_8c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_98,&local_9c);
    if (uVar4 != 0) {
      pcVar14 = "add tri";
      uVar9 = 0x880;
      goto LAB_0012414e;
    }
    iVar16 = ref_mpi->n;
    iVar6 = ref_mpi->id;
    iVar8 = (iVar16 + 0x17) / iVar16;
    iVar7 = (int)(0xf / (long)iVar8);
    iVar5 = (int)(0x17 / (long)iVar16);
    iVar15 = 0x18 - iVar5 * iVar16;
  }
  else {
    iVar16 = (int)(0xd / (long)iVar8);
    if (iVar15 <= iVar16) {
      iVar16 = (0xd - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar16) goto LAB_00122ad9;
    iVar16 = (int)(0xe / (long)iVar8);
    if (iVar15 <= iVar16) {
      iVar16 = (0xe - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar16) goto LAB_00122ad9;
    iVar7 = (int)(0xf / (long)iVar8);
    iVar16 = iVar7;
    if (iVar15 <= iVar7) {
      iVar16 = (0xf - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar16) goto LAB_00122ad9;
  }
  local_8c[1] = 6;
  if (iVar15 <= iVar7) {
    iVar7 = (0xf - iVar15 * iVar8) / iVar5 + iVar15;
  }
  if (iVar6 == iVar7) {
LAB_001230a5:
    uVar4 = ref_node_add(ref_node,0xf,&local_98);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x891;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_98;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.49999999999999883;
    pRVar3[1] = 0.25;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0x10,&local_94);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x893;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_94;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.37499999999999895;
    pRVar3[1] = 0.28349364905389096;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0x11,&local_90);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x895;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_90;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.2834936490538899;
    pRVar3[1] = 0.3750000000000007;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_90 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0x12,local_8c);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x897;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_8c[0];
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.25;
    pRVar3[1] = 0.5000000000000008;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_8c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_98,&local_9c);
    if (uVar4 != 0) {
      pcVar14 = "add tri";
      uVar9 = 0x899;
      goto LAB_0012414e;
    }
    iVar16 = ref_mpi->n;
    iVar6 = ref_mpi->id;
    iVar8 = (iVar16 + 0x17) / iVar16;
    iVar7 = (int)(0x12 / (long)iVar8);
    iVar5 = (int)(0x17 / (long)iVar16);
    iVar15 = 0x18 - iVar5 * iVar16;
  }
  else {
    iVar16 = (int)(0x10 / (long)iVar8);
    if (iVar15 <= iVar16) {
      iVar16 = (0x10 - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar16) goto LAB_001230a5;
    iVar16 = (int)(0x11 / (long)iVar8);
    if (iVar15 <= iVar16) {
      iVar16 = (0x11 - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar16) goto LAB_001230a5;
    iVar7 = (int)(0x12 / (long)iVar8);
    iVar16 = iVar7;
    if (iVar15 <= iVar7) {
      iVar16 = (0x12 - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar16) goto LAB_001230a5;
  }
  local_8c[1] = 7;
  if (iVar15 <= iVar7) {
    iVar7 = (0x12 - iVar15 * iVar8) / iVar5 + iVar15;
  }
  if (iVar6 == iVar7) {
LAB_00123671:
    uVar4 = ref_node_add(ref_node,0x12,&local_98);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x8aa;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_98;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.25;
    pRVar3[1] = 0.5000000000000008;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0x13,&local_94);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x8ac;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_94;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.28349364905389063;
    pRVar3[1] = 0.6250000000000006;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0x14,&local_90);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x8ae;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_90;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.37500000000000056;
    pRVar3[1] = 0.7165063509461099;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_90 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0x15,local_8c);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x8b0;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_8c[0];
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.5000000000000004;
    pRVar3[1] = 0.75;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_8c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_98,&local_9c);
    if (uVar4 != 0) {
      pcVar14 = "add tri";
      uVar9 = 0x8b2;
      goto LAB_0012414e;
    }
    iVar16 = ref_mpi->n;
    iVar6 = ref_mpi->id;
    iVar8 = (iVar16 + 0x17) / iVar16;
    iVar7 = (int)(0x15 / (long)iVar8);
    iVar5 = (int)(0x17 / (long)iVar16);
    iVar15 = 0x18 - iVar5 * iVar16;
  }
  else {
    iVar16 = (int)(0x13 / (long)iVar8);
    if (iVar15 <= iVar16) {
      iVar16 = (0x13 - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar16) goto LAB_00123671;
    iVar16 = (int)(0x14 / (long)iVar8);
    if (iVar15 <= iVar16) {
      iVar16 = (0x14 - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar16) goto LAB_00123671;
    iVar7 = (int)(0x15 / (long)iVar8);
    iVar16 = iVar7;
    if (iVar15 <= iVar7) {
      iVar16 = (0x15 - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar16) goto LAB_00123671;
  }
  local_8c[1] = 8;
  if (iVar15 <= iVar7) {
    iVar7 = (0x15 - iVar15 * iVar8) / iVar5 + iVar15;
  }
  if (iVar6 == iVar7) {
LAB_00123c32:
    uVar4 = ref_node_add(ref_node,0x15,&local_98);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x8c3;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_98;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.5000000000000004;
    pRVar3[1] = 0.75;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0x16,&local_94);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x8c5;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_94;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.6250000000000002;
    pRVar3[1] = 0.7165063509461095;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0x17,&local_90);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x8c7;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_90;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.7165063509461097;
    pRVar3[1] = 0.6249999999999999;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_90 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,0xc,local_8c);
    if (uVar4 != 0) {
      pcVar14 = "add node";
      uVar9 = 0x8c9;
      goto LAB_0012414e;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_8c[0];
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.75;
    pRVar3[1] = 0.5;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_8c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar8 = ref_mpi->n;
    iVar6 = (iVar8 + 0x17) / iVar8;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_8c[0]) && (local_8c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar16 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar16;
      RVar10 = iVar8 + (int)((lVar11 - iVar6 * iVar8) / (long)iVar16);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[2],&local_98,&local_9c);
    if (uVar4 != 0) {
      pcVar14 = "add tri";
      uVar9 = 0x8cb;
      goto LAB_0012414e;
    }
  }
  else {
    iVar16 = (int)(0x16 / (long)iVar8);
    if (iVar15 <= iVar16) {
      iVar16 = (0x16 - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar16) goto LAB_00123c32;
    iVar16 = (int)(0x17 / (long)iVar8);
    if (iVar15 <= iVar16) {
      iVar16 = (0x17 - iVar15 * iVar8) / iVar5 + iVar15;
    }
    if (iVar6 == iVar16) goto LAB_00123c32;
    iVar16 = (int)(0xc / (long)iVar8);
    if (iVar15 <= iVar16) {
      iVar16 = (0xc - iVar8 * iVar15) / iVar5 + iVar15;
    }
    if (iVar6 == iVar16) goto LAB_00123c32;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,0x18);
  if (uVar4 == 0) {
    return 0;
  }
  pcVar14 = "init glob";
  uVar9 = 0x8ce;
LAB_0012414e:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar9,
         "ref_fixture_twod_square_circle",(ulong)uVar4,pcVar14);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_twod_square_circle(REF_GRID *ref_grid_ptr,
                                                  REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 24;
  REF_DBL x0 = 0.5, y0 = 0.5, r = 0.25, t;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  local[4] = 1;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0 / 3.0, 0.0, 0.0);
    add_that_node(2, 2.0 / 3.0, 0.0, 0.0);
    add_that_node(3, 1.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 3;
  global[1] = 4;
  global[2] = 5;
  global[3] = 6;
  local[4] = 2;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 1.0, 0.0, 0.0);
    add_that_node(1, 1.0, 1.0 / 3.0, 0.0);
    add_that_node(2, 1.0, 2.0 / 3.0, 0.0);
    add_that_node(3, 1.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 6;
  global[1] = 7;
  global[2] = 8;
  global[3] = 9;
  local[4] = 3;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 1.0, 1.0, 0.0);
    add_that_node(1, 2.0 / 3.0, 1.0, 0.0);
    add_that_node(2, 1.0 / 3.0, 1.0, 0.0);
    add_that_node(3, 0.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 9;
  global[1] = 10;
  global[2] = 11;
  global[3] = 0;
  local[4] = 4;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 1.0, 0.0);
    add_that_node(1, 0.0, 2.0 / 3.0, 0.0);
    add_that_node(2, 0.0, 1.0 / 3.0, 0.0);
    add_that_node(3, 0.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 12;
  global[1] = 13;
  global[2] = 14;
  global[3] = 15;
  local[4] = 5;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    t = ref_math_pi * (12.0 / 6.0);
    add_that_node(0, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (11.0 / 6.0);
    add_that_node(1, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (10.0 / 6.0);
    add_that_node(2, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (9.0 / 6.0);
    add_that_node(3, x0 + r * cos(t), y0 + r * sin(t), 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 15;
  global[1] = 16;
  global[2] = 17;
  global[3] = 18;
  local[4] = 6;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    t = ref_math_pi * (9.0 / 6.0);
    add_that_node(0, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (8.0 / 6.0);
    add_that_node(1, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (7.0 / 6.0);
    add_that_node(2, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (6.0 / 6.0);
    add_that_node(3, x0 + r * cos(t), y0 + r * sin(t), 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 18;
  global[1] = 19;
  global[2] = 20;
  global[3] = 21;
  local[4] = 7;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    t = ref_math_pi * (6.0 / 6.0);
    add_that_node(0, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (5.0 / 6.0);
    add_that_node(1, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (4.0 / 6.0);
    add_that_node(2, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (3.0 / 6.0);
    add_that_node(3, x0 + r * cos(t), y0 + r * sin(t), 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 21;
  global[1] = 22;
  global[2] = 23;
  global[3] = 12;
  local[4] = 8;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    t = ref_math_pi * (3.0 / 6.0);
    add_that_node(0, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (2.0 / 6.0);
    add_that_node(1, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (1.0 / 6.0);
    add_that_node(2, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (0.0 / 6.0);
    add_that_node(3, x0 + r * cos(t), y0 + r * sin(t), 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}